

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O0

void __thiscall s2shapeutil::EdgeIterator::Next(EdgeIterator *this)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  int32 local_28;
  S2Shape *shape;
  EdgeIterator *this_local;
  
  while( true ) {
    iVar1 = this->edge_id_ + 1;
    this->edge_id_ = iVar1;
    if (iVar1 < this->num_edges_) {
      return;
    }
    iVar2 = this->shape_id_ + 1;
    this->shape_id_ = iVar2;
    iVar1 = (*this->index_->_vptr_S2ShapeIndex[2])();
    if (iVar1 <= iVar2) break;
    iVar1 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)this->shape_id_);
    if ((long *)CONCAT44(extraout_var,iVar1) == (long *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))();
    }
    this->num_edges_ = local_28;
    this->edge_id_ = -1;
  }
  return;
}

Assistant:

void EdgeIterator::Next() {
  while (++edge_id_ >= num_edges_) {
    if (++shape_id_ >= index_->num_shape_ids()) break;
    S2Shape* shape = index_->shape(shape_id_);
    num_edges_ = (shape == nullptr) ? 0 : shape->num_edges();
    edge_id_ = -1;
  }
}